

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

bool __thiscall choc::value::Type::Object::operator==(Object *this,Object *other)

{
  MemberNameAndType *pMVar1;
  MemberNameAndType *pMVar2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  
  __x._M_len = (this->className)._M_len;
  __x._M_str = (this->className)._M_str;
  __y._M_len = (other->className)._M_len;
  __y._M_str = (other->className)._M_str;
  bVar3 = std::operator!=(__x,__y);
  if ((bVar3) || ((this->members).size != (other->members).size)) {
    bVar3 = false;
  }
  else {
    uVar5 = 0xffffffffffffffff;
    lVar6 = 0x10;
    do {
      uVar5 = uVar5 + 1;
      bVar3 = (this->members).size <= uVar5;
      if (bVar3) {
        return bVar3;
      }
      pMVar1 = (this->members).items;
      pMVar2 = (other->members).items;
      __y_00._M_str = *(char **)((long)pMVar2 + lVar6 + -8);
      __y_00._M_len = *(size_t *)((long)pMVar2 + lVar6 + -0x10);
      __x_00._M_str = *(char **)((long)pMVar1 + lVar6 + -8);
      __x_00._M_len = *(size_t *)((long)pMVar1 + lVar6 + -0x10);
      bVar4 = std::operator!=(__x_00,__y_00);
      if (bVar4) {
        return bVar3;
      }
      bVar4 = operator!=((Type *)((long)&(((this->members).items)->name)._M_len + lVar6),
                         (Type *)((long)&(((other->members).items)->name)._M_len + lVar6));
      lVar6 = lVar6 + 0x30;
    } while (!bVar4);
  }
  return bVar3;
}

Assistant:

bool operator== (const Object& other) const
    {
        if (className != other.className)
            return false;

        if (members.size != other.members.size)
            return false;

        for (uint32_t i = 0; i < members.size; ++i)
            if (members[i].name != other.members[i].name
                    || members[i].type != other.members[i].type)
                return false;

        return true;
    }